

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall
spv::Builder::accessChainStore
          (Builder *this,Id rvalue,Decoration nonUniform,MemoryAccessMask memoryAccess,Scope scope,
          uint alignment)

{
  pointer *ppuVar1;
  Instruction *pIVar2;
  iterator __position;
  Id IVar3;
  uint uVar4;
  Id IVar5;
  StorageClass SVar6;
  Id IVar7;
  pointer puVar8;
  MemoryAccessMask memoryAccess_00;
  ulong uVar9;
  Id local_60;
  uint local_5c;
  Id local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  Module *local_40;
  ulong local_38;
  
  if ((this->accessChain).isRValue != false) {
    __assert_fail("accessChain.isRValue == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xf87,
                  "void spv::Builder::accessChainStore(Id, Decoration, spv::MemoryAccessMask, spv::Scope, unsigned int)"
                 );
  }
  transferAccessChainSwizzle(this,true);
  if ((this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    IVar3 = getResultingAccessChainType(this);
    uVar4 = getNumTypeConstituents(this,IVar3);
    if (((long)(this->accessChain).swizzle.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->accessChain).swizzle.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2 != (ulong)uVar4) &&
       ((this->accessChain).component == 0)) {
      puVar8 = (this->accessChain).swizzle.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->accessChain).swizzle.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar8) {
        local_48 = &(this->accessChain).indexChain;
        local_38 = (ulong)rvalue;
        local_40 = &this->module;
        uVar9 = 0;
        local_5c = alignment;
        do {
          uVar4 = puVar8[uVar9];
          IVar3 = makeIntegerType(this,0x20,false);
          local_4c = makeIntConstant(this,IVar3,uVar4,false);
          __position._M_current =
               (this->accessChain).indexChain.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->accessChain).indexChain.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_48,__position,&local_4c);
          }
          else {
            *__position._M_current = local_4c;
            (this->accessChain).indexChain.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          (this->accessChain).instr = 0;
          IVar3 = collapseAccessChain(this);
          addDecoration(this,IVar3,nonUniform,-1);
          ppuVar1 = &(this->accessChain).indexChain.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + -1;
          (this->accessChain).instr = 0;
          if ((this->accessChain).component != 0) {
            __assert_fail("accessChain.component == NoResult",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                          ,0xf9a,
                          "void spv::Builder::accessChainStore(Id, Decoration, spv::MemoryAccessMask, spv::Scope, unsigned int)"
                         );
          }
          pIVar2 = (this->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[local_38];
          IVar5 = 0;
          IVar7 = 0;
          if (pIVar2 != (Instruction *)0x0) {
            IVar7 = pIVar2->typeId;
          }
          IVar7 = getContainedTypeId(this,IVar7,0);
          IVar7 = createCompositeExtract(this,rvalue,IVar7,(uint)uVar9);
          pIVar2 = (this->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[IVar3];
          if (pIVar2 != (Instruction *)0x0) {
            IVar5 = pIVar2->typeId;
          }
          local_5c = local_5c & -local_5c;
          SVar6 = Module::getStorageClass(local_40,IVar5);
          if (SVar6 == PhysicalStorageBuffer) {
            memoryAccess = memoryAccess | Aligned;
          }
          createStore(this,IVar7,IVar3,memoryAccess,scope,local_5c);
          uVar9 = (ulong)((uint)uVar9 + 1);
          puVar8 = (this->accessChain).swizzle.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(this->accessChain).swizzle.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >>
                                2));
      }
      return;
    }
  }
  IVar3 = collapseAccessChain(this);
  addDecoration(this,IVar3,nonUniform,-1);
  if ((this->accessChain).component == 0) {
    local_60 = rvalue;
    if ((this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      IVar7 = 0;
      IVar5 = createLoad(this,IVar3,DecorationMax,MaskNone,Max,0);
      pIVar2 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[IVar5];
      if (pIVar2 != (Instruction *)0x0) {
        IVar7 = pIVar2->typeId;
      }
      local_60 = createLvalueSwizzle(this,IVar7,IVar5,rvalue,&(this->accessChain).swizzle);
    }
    pIVar2 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[IVar3];
    if (pIVar2 == (Instruction *)0x0) {
      IVar7 = 0;
    }
    else {
      IVar7 = pIVar2->typeId;
    }
    SVar6 = Module::getStorageClass(&this->module,IVar7);
    memoryAccess_00 = memoryAccess | Aligned;
    if (SVar6 != PhysicalStorageBuffer) {
      memoryAccess_00 = memoryAccess;
    }
    createStore(this,local_60,IVar3,memoryAccess_00,scope,-alignment & alignment);
    return;
  }
  __assert_fail("accessChain.component == NoResult",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0xfae,
                "void spv::Builder::accessChainStore(Id, Decoration, spv::MemoryAccessMask, spv::Scope, unsigned int)"
               );
}

Assistant:

void Builder::accessChainStore(Id rvalue, Decoration nonUniform, spv::MemoryAccessMask memoryAccess, spv::Scope scope, unsigned int alignment)
{
    assert(accessChain.isRValue == false);

    transferAccessChainSwizzle(true);

    // If a swizzle exists and is not full and is not dynamic, then the swizzle will be broken into individual stores.
    if (accessChain.swizzle.size() > 0 &&
        getNumTypeComponents(getResultingAccessChainType()) != accessChain.swizzle.size() &&
        accessChain.component == NoResult) {
        for (unsigned int i = 0; i < accessChain.swizzle.size(); ++i) {
            accessChain.indexChain.push_back(makeUintConstant(accessChain.swizzle[i]));
            accessChain.instr = NoResult;

            Id base = collapseAccessChain();
            addDecoration(base, nonUniform);

            accessChain.indexChain.pop_back();
            accessChain.instr = NoResult;

            // dynamic component should be gone
            assert(accessChain.component == NoResult);

            Id source = createCompositeExtract(rvalue, getContainedTypeId(getTypeId(rvalue)), i);

            // take LSB of alignment
            alignment = alignment & ~(alignment & (alignment-1));
            if (getStorageClass(base) == StorageClassPhysicalStorageBufferEXT) {
                memoryAccess = (spv::MemoryAccessMask)(memoryAccess | spv::MemoryAccessAlignedMask);
            }

            createStore(source, base, memoryAccess, scope, alignment);
        }
    }
    else {
        Id base = collapseAccessChain();
        addDecoration(base, nonUniform);

        Id source = rvalue;

        // dynamic component should be gone
        assert(accessChain.component == NoResult);

        // If swizzle still exists, it may be out-of-order, we must load the target vector,
        // extract and insert elements to perform writeMask and/or swizzle.
        if (accessChain.swizzle.size() > 0) {
            Id tempBaseId = createLoad(base, spv::NoPrecision);
            source = createLvalueSwizzle(getTypeId(tempBaseId), tempBaseId, source, accessChain.swizzle);
        }

        // take LSB of alignment
        alignment = alignment & ~(alignment & (alignment-1));
        if (getStorageClass(base) == StorageClassPhysicalStorageBufferEXT) {
            memoryAccess = (spv::MemoryAccessMask)(memoryAccess | spv::MemoryAccessAlignedMask);
        }

        createStore(source, base, memoryAccess, scope, alignment);
    }
}